

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O0

void ggml_backend_cpu_device_get_props(ggml_backend_dev_t dev,ggml_backend_dev_props *props)

{
  ggml_backend_dev_type gVar1;
  _func_char_ptr_ggml_backend_dev_t *p_Var2;
  ggml_backend_dev_t in_RSI;
  ggml_backend_dev_t in_RDI;
  
  p_Var2 = (_func_char_ptr_ggml_backend_dev_t *)ggml_backend_cpu_device_get_name(in_RDI);
  (in_RSI->iface).get_name = p_Var2;
  p_Var2 = (_func_char_ptr_ggml_backend_dev_t *)ggml_backend_cpu_device_get_description(in_RSI);
  (in_RSI->iface).get_description = p_Var2;
  gVar1 = ggml_backend_cpu_device_get_type(in_RDI);
  *(ggml_backend_dev_type *)&(in_RSI->iface).get_props = gVar1;
  ggml_backend_cpu_device_get_memory
            (in_RDI,(size_t *)&(in_RSI->iface).get_memory,(size_t *)&(in_RSI->iface).get_type);
  *(undefined4 *)((long)&(in_RSI->iface).get_props + 4) = 0x10000;
  return;
}

Assistant:

static void ggml_backend_cpu_device_get_props(ggml_backend_dev_t dev, struct ggml_backend_dev_props * props) {
    props->name        = ggml_backend_cpu_device_get_name(dev);
    props->description = ggml_backend_cpu_device_get_description(dev);
    props->type        = ggml_backend_cpu_device_get_type(dev);
    ggml_backend_cpu_device_get_memory(dev, &props->memory_free, &props->memory_total);
    props->caps = {
        /* .async                 = */ false,
        /* .host_buffer           = */ false,
        /* .buffer_from_host_ptr  = */ true,
        /* .events                = */ false,
    };
}